

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O2

void __thiscall DIS::RadioEntityType::RadioEntityType(RadioEntityType *this)

{
  this->_vptr_RadioEntityType = (_func_int **)&PTR__RadioEntityType_001b1c48;
  this->_entityKind = '\0';
  this->_domain = '\0';
  this->_country = 0;
  this->_category = '\0';
  this->_nomenclatureVersion = '\0';
  this->_nomenclature = 0;
  return;
}

Assistant:

RadioEntityType::RadioEntityType():
   _entityKind(0), 
   _domain(0), 
   _country(0), 
   _category(0), 
   _nomenclatureVersion(0), 
   _nomenclature(0)
{
}